

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLScanner::scanMiscellaneous(XMLScanner *this)

{
  ReaderMgr *this_00;
  XMLDocumentHandler *pXVar1;
  bool bVar2;
  XMLCh XVar3;
  XMLBuffer *toRelease;
  XMLBufBid bbCData;
  
  toRelease = XMLBufferMgr::bidOnBuffer(&this->fBufMgr);
  this_00 = &this->fReaderMgr;
LAB_002c816f:
  do {
    XVar3 = ReaderMgr::peekNextChar(this_00);
    if (XVar3 == L'<') {
      bVar2 = checkXMLDecl(this,true);
      if (bVar2) {
        emitError(this,NotValidAfterContent);
        do {
          XVar3 = ReaderMgr::getNextChar(this_00);
          if (XVar3 == L'\0') break;
        } while (XVar3 != L'>');
      }
      else {
        bVar2 = XMLReader::skippedString((this->fReaderMgr).fCurReader,L"<?");
        if (bVar2) {
          scanPI(this);
        }
        else {
          bVar2 = XMLReader::skippedString
                            ((this->fReaderMgr).fCurReader,(XMLCh *)XMLUni::fgCommentString);
          if (bVar2) {
            scanComment(this);
          }
          else {
            emitError(this,ExpectedCommentOrPI);
            do {
              XVar3 = ReaderMgr::getNextChar(this_00);
              if (XVar3 == L'\0') break;
            } while (XVar3 != L'>');
          }
        }
      }
      goto LAB_002c816f;
    }
    if (XVar3 == L'\0') {
      XMLBufferMgr::releaseBuffer(&this->fBufMgr,toRelease);
      return;
    }
    if ((char)((this->fReaderMgr).fCurReader)->fgCharCharsTable[(ushort)XVar3] < '\0') {
      if (this->fDocHandler == (XMLDocumentHandler *)0x0) {
        ReaderMgr::skipPastSpaces(this_00);
      }
      else {
        ReaderMgr::getSpaces(this_00,toRelease);
        pXVar1 = this->fDocHandler;
        toRelease->fBuffer[toRelease->fIndex] = L'\0';
        (*pXVar1->_vptr_XMLDocumentHandler[8])();
      }
    }
    else {
      emitError(this,ExpectedCommentOrPI);
      do {
        XVar3 = ReaderMgr::getNextChar(this_00);
        if (XVar3 == L'\0') break;
      } while (XVar3 != L'>');
    }
  } while( true );
}

Assistant:

void XMLScanner::scanMiscellaneous()
{
    // Get a buffer for this work
    XMLBufBid bbCData(&fBufMgr);

    while (true)
    {
        try
        {
            const XMLCh nextCh = fReaderMgr.peekNextChar();

            // Watch for end of file and break out
            if (!nextCh)
                break;

            if (nextCh == chOpenAngle)
            {
                if (checkXMLDecl(true))
                {
                    // Can't have an XML decl here
                    emitError(XMLErrs::NotValidAfterContent);
                    fReaderMgr.skipPastChar(chCloseAngle);
                }
                else if (fReaderMgr.skippedString(XMLUni::fgPIString))
                {
                    scanPI();
                }
                 else if (fReaderMgr.skippedString(XMLUni::fgCommentString))
                {
                    scanComment();
                }
                else
                {
                    // This can't be possible, so just give up
                    emitError(XMLErrs::ExpectedCommentOrPI);
                    fReaderMgr.skipPastChar(chCloseAngle);
                }
            }
            else if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
            {
                //  If we have a doc handler, then gather up the spaces and
                //  call back. Otherwise, just skip over whitespace.
                if (fDocHandler)
                {
                    fReaderMgr.getSpaces(bbCData.getBuffer());
                    fDocHandler->ignorableWhitespace
                    (
                        bbCData.getRawBuffer()
                        , bbCData.getLen()
                        , false
                    );
                }
                else
                {
                    fReaderMgr.skipPastSpaces();
                }
            }
            else
            {
                emitError(XMLErrs::ExpectedCommentOrPI);
                fReaderMgr.skipPastChar(chCloseAngle);
            }
        }
        catch(const EndOfEntityException&)
        {
            //  Some entity leaked out of the content part of the document. Issue
            //  a warning and keep going.
            emitError(XMLErrs::EntityPropogated);
        }
    }
}